

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

void __thiscall findstr::searchsequential(findstr *this,filehandle *f,string *origin)

{
  element_type *peVar1;
  pointer __dest;
  pointer pcVar2;
  int __fd;
  ssize_t sVar3;
  pointer pcVar4;
  int iVar5;
  ulong uVar6;
  pointer __src;
  pointer pcVar7;
  size_t __n;
  uint uVar8;
  size_type local_b8;
  shared_ptr<SearchBase> searcher;
  vector<char,_std::allocator<char>_> buf;
  undefined1 local_70 [32];
  _Function_base local_50;
  undefined4 extraout_var;
  
  this->nameprinted = false;
  this->matchcount = 0;
  std::vector<char,_std::allocator<char>_>::vector(&buf,0x100000,(allocator_type *)local_70);
  pcVar2 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  __dest = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  makesearcher((findstr *)&searcher);
  local_b8 = 0;
  pcVar4 = __dest;
  while( true ) {
    iVar5 = (int)pcVar2 - (int)pcVar4;
    while( true ) {
      __fd = filehandle::fh(f);
      sVar3 = read(__fd,pcVar4,(long)iVar5);
      peVar1 = searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar8 = (uint)sVar3;
      if (uVar8 != 0) break;
      if (this->readcontinuous != true) goto LAB_0010edbe;
      usleep(100);
    }
    if ((iVar5 < (int)uVar8) || ((int)uVar8 < 0)) break;
    local_70._8_8_ = __dest;
    local_70._16_8_ = local_b8;
    local_70._0_8_ = origin;
    local_70._24_8_ = this;
    std::function<bool(char_const*,char_const*)>::
    function<findstr::searchsequential(filehandle&,std::__cxx11::string_const&)::_lambda(char_const*,char_const*)_1_,void>
              ((function<bool(char_const*,char_const*)> *)&local_50,
               (anon_class_32_4_06483525 *)local_70);
    pcVar7 = pcVar4 + (uVar8 & 0x7fffffff);
    iVar5 = (*peVar1->_vptr_SearchBase[2])(peVar1,__dest,pcVar7,&local_50);
    pcVar4 = (pointer)CONCAT44(extraout_var,iVar5);
    std::_Function_base::~_Function_base(&local_50);
    if ((pcVar4 == (pointer)0x0) || (this->matchstart != false)) break;
    uVar6 = (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    __src = __dest + (uVar6 >> 1);
    if ((long)(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / 2) <=
        (long)pcVar4 - (long)__dest) {
      __src = pcVar4;
    }
    pcVar4 = __dest;
    if (__src < pcVar7) {
      __n = (long)pcVar7 - (long)__src;
      memcpy(__dest,__src,__n);
      pcVar4 = __dest + __n;
      uVar8 = uVar8 - (int)__n;
    }
    local_b8 = local_b8 + (long)(int)uVar8;
  }
LAB_0010edbe:
  if (this->count_only == true) {
    print<int&,char_const(&)[2]>("%6d %s\n",&this->matchcount,(char (*) [2])"-");
  }
  if (this->nameprinted == true) {
    print<>("\n");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&searcher.super___shared_ptr<SearchBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void searchsequential(filehandle& f, const std::string& origin)
    {
        //printf("searching stdin\n");
        // see: http://www.boost.org/doc/libs/1_52_0/libs/regex/doc/html/boost_regex/partial_matches.html

        nameprinted = false;
        matchcount = 0;

        std::vector<char> buf(0x100000);
        char *bufstart = &buf.front();
        char *bufend = bufstart + buf.size();
        uint64_t offset = 0;

        auto searcher = makesearcher();

        char *readptr = bufstart;

        while (true)
        {
            int needed = bufend - readptr;
            //print("%08x ; %x: needed = %d -> %p .. %p .. %p\n", offset, lseek(f, 0, 1), needed, bufstart, readptr, bufend);
            int n = read(f, readptr, needed);
            if (n == 0) {
                if (readcontinuous) {
                    //printf("stdin: waiting for more\n");
#ifdef _WIN32
                    Sleep(10);
#else
                    usleep(100);
#endif
                    continue;
                }
                //print("read empty(need=%d), pos=%d\n", needed, lseek(f, 0, 1));
                break;
            }
            else if (n > needed || n < 0)
            {
                //perror("read");
                //print("n=%d\n", n);
                break;
            }

            char *readend = readptr + n;
            const char *partial;

            partial = searcher->search(bufstart, readend, [&origin, bufstart, offset, this](const char *first, const char *last)->bool {
                return writeresult(origin, bufstart, offset, first, last);
            });
            if (partial==NULL)  // writeresult told searcher to stop
                break;
            if (matchstart)
                break;

            // avoid too large partial matches
            if (partial - bufstart < (int)buf.size()/2)
                partial = bufstart + buf.size()/2;

            // relocate data for partial matches
            if (partial < readend) {
                memcpy(bufstart, partial, readend - partial);
                readptr = bufstart + (readend - partial);
                n -= (readend - partial);
            }
            else {
                readptr = bufstart;
            }

            offset += n;
        }
        if (count_only)
            print("%6d %s\n", matchcount, "-");
        if (nameprinted)
            print("\n");
    }